

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

void __thiscall State::advance(State *this)

{
  point p;
  
  p = nextPos(this);
  this->position = p;
  Grid::setslime(&this->cg,p,true);
  *(byte *)&this->flags = (byte)this->flags & 0xfe;
  return;
}

Assistant:

void State::advance() {
    position = nextPos();
    cg.setslime(position, 1);
    flags &= ~SF_NON_MOVE_MATCH;
}